

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<unsigned_int,float>(Thread *this,UnopFunc<unsigned_int,_float> *f)

{
  uint uVar1;
  long lVar2;
  SR result;
  Simd<float,_(unsigned_char)__x04_> val;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  
  local_28.v128_.v = (v128)Pop(this);
  lVar2 = 0;
  do {
    uVar1 = (*f)(*(float *)((long)&local_28 + lVar2));
    *(uint *)((long)&local_38 + lVar2) = uVar1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  Push(this,(Value)local_38.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}